

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sproto.c
# Opt level: O0

int encode_uint64(uint64_t v,uint8_t *data,int size)

{
  int size_local;
  uint8_t *data_local;
  uint64_t v_local;
  
  if ((uint)size < 0xc) {
    v_local._4_4_ = -1;
  }
  else {
    data[4] = (uint8_t)v;
    data[5] = (uint8_t)(v >> 8);
    data[6] = (uint8_t)(v >> 0x10);
    data[7] = (uint8_t)(v >> 0x18);
    data[8] = (uint8_t)(v >> 0x20);
    data[9] = (uint8_t)(v >> 0x28);
    data[10] = (uint8_t)(v >> 0x30);
    data[0xb] = (uint8_t)(v >> 0x38);
    v_local._4_4_ = fill_size(data,8);
  }
  return v_local._4_4_;
}

Assistant:

static int
encode_uint64(uint64_t v, uint8_t * data, int size) {
	if (size < SIZEOF_LENGTH + sizeof(v))
		return -1;
	data[4] = v & 0xff;
	data[5] = (v >> 8) & 0xff;
	data[6] = (v >> 16) & 0xff;
	data[7] = (v >> 24) & 0xff;
	data[8] = (v >> 32) & 0xff;
	data[9] = (v >> 40) & 0xff;
	data[10] = (v >> 48) & 0xff;
	data[11] = (v >> 56) & 0xff;
	return fill_size(data, sizeof(v));
}